

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::String>(Promise<void> *this,String *attachments)

{
  char *pcVar1;
  size_t sVar2;
  PromiseNode *pPVar3;
  long *in_RDX;
  AttachmentPromiseNode<kj::String> *pAVar4;
  AttachmentPromiseNode<kj::String> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::String>_> OVar5;
  Promise<void> PVar6;
  String local_38;
  Disposer *local_18;
  PromiseNode *pPStack_10;
  
  local_38.content.ptr = (char *)*in_RDX;
  local_38.content.size_ = in_RDX[1];
  local_38.content.disposer = (ArrayDisposer *)in_RDX[2];
  *in_RDX = 0;
  in_RDX[1] = 0;
  OVar5 = heap<kj::_::AttachmentPromiseNode<kj::String>,kj::Own<kj::_::PromiseNode>,kj::String>
                    ((kj *)&local_18,(Own<kj::_::PromiseNode> *)attachments,&local_38);
  pPVar3 = pPStack_10;
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  pAVar4 = OVar5.ptr;
  pPStack_10 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.disposer = local_18;
  (this->super_PromiseBase).node.ptr = pPVar3;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pAVar4 = extraout_RDX;
  }
  PVar6.super_PromiseBase.node.ptr = (PromiseNode *)pAVar4;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}